

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

void deflate_optimize_and_flush_block
               (libdeflate_compressor *c,deflate_output_bitstream *os,u8 *block_begin,
               u32 block_length,lz_match *cache_ptr,_Bool is_first_block,_Bool is_final_block,
               _Bool *used_only_literals)

{
  u32 uVar1;
  u32 uVar2;
  libdeflate_compressor *block_begin_00;
  uint in_ECX;
  libdeflate_compressor *in_RDI;
  undefined1 *in_stack_00000010;
  u32 i;
  deflate_sequence *seq;
  deflate_sequence seq_;
  u32 static_cost;
  u32 only_lits_cost;
  u32 true_cost;
  u32 best_true_cost;
  uint num_passes_remaining;
  _Bool in_stack_0000008f;
  deflate_sequence *in_stack_00000090;
  u8 *in_stack_000000a0;
  deflate_output_bitstream *in_stack_000000a8;
  libdeflate_compressor *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar3;
  libdeflate_compressor *in_stack_ffffffffffffff80;
  libdeflate_compressor *c_00;
  undefined4 in_stack_ffffffffffffff90;
  uint local_54;
  lz_match *cache_ptr_00;
  u32 in_stack_ffffffffffffffbc;
  uint uVar4;
  uint local_34;
  uint local_30;
  
  local_30 = (in_RDI->p).n.max_optim_passes;
  local_34 = 0xffffffff;
  uVar4 = 0xffffffff;
  cache_ptr_00 = (lz_match *)0x0;
  uVar3 = in_ECX;
  deflate_choose_all_literals
            (in_stack_ffffffffffffff80,
             (u8 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
  uVar1 = deflate_compute_true_cost(in_stack_ffffffffffffff80);
  local_54 = in_ECX;
  while( true ) {
    block_begin_00 = (libdeflate_compressor *)(ulong)local_54;
    if (in_ECX + 0x101 < 0x4a768) {
      c_00 = (libdeflate_compressor *)(ulong)(in_ECX + 0x101);
    }
    else {
      c_00 = (libdeflate_compressor *)0x4a767;
    }
    if (c_00 < block_begin_00) break;
    *(undefined4 *)((long)&in_RDI->p + (ulong)local_54 * 8 + 0x639584) = 0x80000000;
    local_54 = local_54 + 1;
  }
  if (in_ECX <= (in_RDI->p).n.max_len_to_optimize_static_block) {
    memcpy((void *)((long)&in_RDI->p + 0x88d950),(void *)((long)&in_RDI->p + 0x88d0c4),0x88c);
    deflate_set_costs_from_codes(in_RDI,&(in_RDI->static_codes).lens);
    deflate_find_min_cost_path
              ((libdeflate_compressor *)CONCAT44(uVar1,uVar4),in_stack_ffffffffffffffbc,cache_ptr_00
              );
    uVar4 = ((in_RDI->p).n.optimum_nodes[0].cost_to_end >> 4) + 7;
    memcpy((void *)((long)&in_RDI->p + 0x88d0c4),(void *)((long)&in_RDI->p + 0x88d950),0x88c);
  }
  deflate_set_initial_costs
            ((libdeflate_compressor *)CONCAT44(uVar3,in_stack_ffffffffffffff90),(u8 *)block_begin_00
             ,(u32)((ulong)c_00 >> 0x20),SUB81((ulong)c_00 >> 0x18,0));
  do {
    deflate_find_min_cost_path
              ((libdeflate_compressor *)CONCAT44(uVar1,uVar4),in_stack_ffffffffffffffbc,cache_ptr_00
              );
    uVar2 = deflate_compute_true_cost(c_00);
    if (local_34 < uVar2 + (in_RDI->p).n.min_improvement_to_continue) break;
    memcpy((void *)((long)&in_RDI->p + 0x88d950),(void *)((long)&in_RDI->p + 0x88d0c4),0x88c);
    deflate_set_costs_from_codes(in_RDI,&(in_RDI->codes).lens);
    local_30 = local_30 - 1;
    local_34 = uVar2;
  } while (local_30 != 0);
  *in_stack_00000010 = 0;
  uVar3 = uVar4;
  if (uVar1 <= uVar4) {
    uVar3 = uVar1;
  }
  if (uVar3 < local_34) {
    if (uVar1 < uVar4) {
      deflate_choose_all_literals(c_00,(u8 *)CONCAT44(uVar3,in_stack_ffffffffffffff78),0);
      deflate_set_costs_from_codes(in_RDI,&(in_RDI->codes).lens);
      *in_stack_00000010 = 1;
    }
    else {
      deflate_set_costs_from_codes(in_RDI,&(in_RDI->static_codes).lens);
      deflate_find_min_cost_path
                ((libdeflate_compressor *)CONCAT44(uVar1,uVar4),in_stack_ffffffffffffffbc,
                 cache_ptr_00);
    }
  }
  else if (local_34 + (in_RDI->p).n.min_bits_to_use_nonfinal_path <= uVar2) {
    memcpy((void *)((long)&in_RDI->p + 0x88d0c4),(void *)((long)&in_RDI->p + 0x88d950),0x88c);
    deflate_find_min_cost_path
              ((libdeflate_compressor *)CONCAT44(uVar1,uVar4),in_stack_ffffffffffffffbc,cache_ptr_00
              );
    deflate_set_costs_from_codes(in_RDI,&(in_RDI->codes).lens);
  }
  deflate_flush_block(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,used_only_literals._4_4_
                      ,in_stack_00000090,in_stack_0000008f);
  return;
}

Assistant:

static void
deflate_optimize_and_flush_block(struct libdeflate_compressor *c,
				 struct deflate_output_bitstream *os,
				 const u8 *block_begin, u32 block_length,
				 const struct lz_match *cache_ptr,
				 bool is_first_block, bool is_final_block,
				 bool *used_only_literals)
{
	unsigned num_passes_remaining = c->p.n.max_optim_passes;
	u32 best_true_cost = UINT32_MAX;
	u32 true_cost;
	u32 only_lits_cost;
	u32 static_cost = UINT32_MAX;
	struct deflate_sequence seq_;
	struct deflate_sequence *seq = NULL;
	u32 i;

	/*
	 * On some data, using only literals (no matches) ends up being better
	 * than what the iterative optimization algorithm produces.  Therefore,
	 * consider using only literals.
	 */
	deflate_choose_all_literals(c, block_begin, block_length);
	only_lits_cost = deflate_compute_true_cost(c);

	/*
	 * Force the block to really end at the desired length, even if some
	 * matches extend beyond it.
	 */
	for (i = block_length;
	     i <= MIN(block_length - 1 + DEFLATE_MAX_MATCH_LEN,
		      ARRAY_LEN(c->p.n.optimum_nodes) - 1); i++)
		c->p.n.optimum_nodes[i].cost_to_end = 0x80000000;

	/*
	 * Sometimes a static Huffman block ends up being cheapest, particularly
	 * if the block is small.  So, if the block is sufficiently small, find
	 * the optimal static block solution and remember its cost.
	 */
	if (block_length <= c->p.n.max_len_to_optimize_static_block) {
		/* Save c->p.n.costs temporarily. */
		c->p.n.costs_saved = c->p.n.costs;

		deflate_set_costs_from_codes(c, &c->static_codes.lens);
		deflate_find_min_cost_path(c, block_length, cache_ptr);
		static_cost = c->p.n.optimum_nodes[0].cost_to_end / BIT_COST;
		static_cost += 7; /* for the end-of-block symbol */

		/* Restore c->p.n.costs. */
		c->p.n.costs = c->p.n.costs_saved;
	}

	/* Initialize c->p.n.costs with default costs. */
	deflate_set_initial_costs(c, block_begin, block_length, is_first_block);

	do {
		/*
		 * Find the minimum-cost path for this pass.
		 * Also set c->freqs and c->codes to match the path.
		 */
		deflate_find_min_cost_path(c, block_length, cache_ptr);

		/*
		 * Compute the exact cost of the block if the path were to be
		 * used.  Note that this differs from
		 * c->p.n.optimum_nodes[0].cost_to_end in that true_cost uses
		 * the actual Huffman codes instead of c->p.n.costs.
		 */
		true_cost = deflate_compute_true_cost(c);

		/*
		 * If the cost didn't improve much from the previous pass, then
		 * doing more passes probably won't be helpful, so stop early.
		 */
		if (true_cost + c->p.n.min_improvement_to_continue >
		    best_true_cost)
			break;

		best_true_cost = true_cost;

		/* Save the cost model that gave 'best_true_cost'. */
		c->p.n.costs_saved = c->p.n.costs;

		/* Update the cost model from the Huffman codes. */
		deflate_set_costs_from_codes(c, &c->codes.lens);

	} while (--num_passes_remaining);

	*used_only_literals = false;
	if (MIN(only_lits_cost, static_cost) < best_true_cost) {
		if (only_lits_cost < static_cost) {
			/* Using only literals ended up being best! */
			deflate_choose_all_literals(c, block_begin, block_length);
			deflate_set_costs_from_codes(c, &c->codes.lens);
			seq_.litrunlen_and_length = block_length;
			seq = &seq_;
			*used_only_literals = true;
		} else {
			/* Static block ended up being best! */
			deflate_set_costs_from_codes(c, &c->static_codes.lens);
			deflate_find_min_cost_path(c, block_length, cache_ptr);
		}
	} else if (true_cost >=
		   best_true_cost + c->p.n.min_bits_to_use_nonfinal_path) {
		/*
		 * The best solution was actually from a non-final optimization
		 * pass, so recover and use the min-cost path from that pass.
		 */
		c->p.n.costs = c->p.n.costs_saved;
		deflate_find_min_cost_path(c, block_length, cache_ptr);
		deflate_set_costs_from_codes(c, &c->codes.lens);
	}
	deflate_flush_block(c, os, block_begin, block_length, seq,
			    is_final_block);
}